

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teleport.c
# Opt level: O1

boolean tele_restrict(monst *mon)

{
  uint uVar1;
  boolean bVar2;
  char *pcVar3;
  
  if (((level->flags).field_0x9 & 8) == 0) {
    bVar2 = '\0';
  }
  else {
    if (mon->wormno == '\0') {
      if ((viz_array[mon->my][mon->mx] & 2U) == 0) {
        if ((u.uprops[0x1e].intrinsic != 0) ||
           (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
            (((youmonst.data)->mflags1 & 0x1000) != 0)))) {
          if (ublindf == (obj *)0x0) {
            return '\x01';
          }
          if (ublindf->oartifact != '\x1d') {
            return '\x01';
          }
        }
        if ((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0) &&
           (((youmonst.data)->mflags3 & 0x100) == 0)) {
          return '\x01';
        }
        if ((viz_array[mon->my][mon->mx] & 1U) == 0) {
          return '\x01';
        }
        if ((mon->data->mflags3 & 0x200) == 0) {
          return '\x01';
        }
      }
    }
    else {
      bVar2 = worm_known(level,mon);
      if (bVar2 == '\0') {
        return '\x01';
      }
    }
    uVar1 = *(uint *)&mon->field_0x60;
    if ((((uVar1 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) || (u.uprops[0xc].extrinsic != 0)) {
      if ((uVar1 & 0x280) != 0) {
        return '\x01';
      }
    }
    else {
      if ((uVar1 & 0x280) != 0) {
        return '\x01';
      }
      if (((youmonst.data)->mflags1 & 0x1000000) == 0) {
        return '\x01';
      }
    }
    bVar2 = '\x01';
    if ((u._1052_1_ & 0x20) == 0) {
      pcVar3 = mon_nam(mon);
      pline("A mysterious force prevents %s from teleporting!",pcVar3);
    }
  }
  return bVar2;
}

Assistant:

boolean tele_restrict(struct monst *mon)
{
	if (level->flags.noteleport) {
		if (canseemon(level, mon))
		    pline("A mysterious force prevents %s from teleporting!",
			mon_nam(mon));
		return TRUE;
	}
	return FALSE;
}